

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O1

type * __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (type *__return_storage_ptr__,
          json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  bool bVar1;
  uchar uVar2;
  semantic_tag tag;
  size_t __n;
  iterator this_00;
  system_error *psVar3;
  conv_error *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *item;
  const_array_range_type cVar4;
  error_code __ec;
  error_code __ec_00;
  error_code ec_00;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  converter;
  error_code ec;
  allocator_type local_51;
  error_code local_50;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_40;
  error_code local_30;
  
  local_50._M_value = 0;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (bVar1) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__return_storage_ptr__,__n);
    cVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    this_00 = cVar4.first_._M_current;
    if (this_00._M_current != cVar4.last_._M_current._M_current) {
      do {
        uVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                as_integer<unsigned_char>(this_00._M_current);
        local_40._0_1_ = uVar2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (__return_storage_ptr__,(uchar *)&local_40);
        this_00._M_current = this_00._M_current + 1;
      } while (this_00._M_current != cVar4.last_._M_current._M_current);
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    if (bVar1) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_byte_string_view
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &local_40.common_);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (uchar *)local_40._0_8_,
                 &((local_40.long_str_.ptr_)->
                  super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>).field_0x0 +
                 local_40._0_8_,&local_51);
      if (local_50._M_value != 0) {
        psVar3 = (system_error *)__cxa_allocate_exception(0x58);
        __ec._4_4_ = 0;
        __ec._M_value = local_50._M_value;
        *(undefined ***)(psVar3 + 0x50) = &PTR__json_exception_00b58738;
        __ec._M_cat = local_50._M_cat;
        std::system_error::system_error(psVar3,__ec);
        *(undefined8 *)psVar3 = 0xb5b5d8;
        *(undefined8 *)(psVar3 + 0x50) = 0xb5b610;
        *(undefined8 *)(psVar3 + 0x20) = 0;
        *(undefined8 *)(psVar3 + 0x28) = 0;
        *(system_error **)(psVar3 + 0x30) = psVar3 + 0x40;
        *(undefined8 *)(psVar3 + 0x38) = 0;
        psVar3[0x40] = (system_error)0x0;
        __cxa_throw(psVar3,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
    else {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      if (!bVar1) {
        this_01 = (conv_error *)__cxa_allocate_exception(0x58);
        std::error_code::error_code<jsoncons::conv_errc,void>(&local_30,not_vector);
        ec_00._4_4_ = 0;
        ec_00._M_value = local_30._M_value;
        ec_00._M_cat = local_30._M_cat;
        conv_error::conv_error(this_01,ec_00);
        __cxa_throw(this_01,&conv_error::typeinfo,conv_error::~conv_error);
      }
      local_40.int64_ =
           (int64_storage)
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                     ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      tag = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::convert<char>(__return_storage_ptr__,
                      (value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_51,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_40.common_,tag,
                      &local_50);
      if (local_50._M_value != 0) {
        psVar3 = (system_error *)__cxa_allocate_exception(0x58);
        __ec_00._4_4_ = 0;
        __ec_00._M_value = local_50._M_value;
        *(undefined ***)(psVar3 + 0x50) = &PTR__json_exception_00b58738;
        __ec_00._M_cat = local_50._M_cat;
        std::system_error::system_error(psVar3,__ec_00);
        *(undefined8 *)psVar3 = 0xb5b5d8;
        *(undefined8 *)(psVar3 + 0x50) = 0xb5b610;
        *(undefined8 *)(psVar3 + 0x20) = 0;
        *(undefined8 *)(psVar3 + 0x28) = 0;
        *(system_error **)(psVar3 + 0x30) = psVar3 + 0x40;
        *(undefined8 *)(psVar3 + 0x38) = 0;
        psVar3[0x40] = (system_error)0x0;
        __cxa_throw(psVar3,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static typename std::enable_if<ext_traits::is_byte<typename Container::value_type>::value,Container>::type
        as(const Json& j)
        {
            std::error_code ec;
            if (j.is_array())
            {
                T result;
                visit_reserve_(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(),result,j.size());
                for (const auto& item : j.array_range())
                {
                    result.push_back(item.template as<value_type>());
                }

                return result;
            }
            else if (j.is_byte_string_view())
            {
                value_converter<byte_string_view,T> converter;
                auto v = converter.convert(j.as_byte_string_view(),j.tag(), ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(conv_error(ec));
                }
                return v;
            }
            else if (j.is_string())
            {
                value_converter<basic_string_view<char>,T> converter;
                auto v = converter.convert(j.as_string_view(),j.tag(), ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(conv_error(ec));
                }
                return v;
            }
            else
            {
                JSONCONS_THROW(conv_error(conv_errc::not_vector));
            }
        }